

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

bool __thiscall cmCTestHG::UpdateImpl(cmCTestHG *this)

{
  string *__args;
  cmCTest *pcVar1;
  bool bVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_139;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_update;
  string opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger err;
  OutputLogger out;
  string local_60 [32];
  string local_40;
  
  __args = &(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool;
  std::__cxx11::string::string((string *)&opts,(string *)__args);
  std::__cxx11::string::string((string *)&out,(string *)&opts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_LineParser.Line._M_string_length,"pull",(allocator<char> *)&err);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"-v",(allocator<char> *)&args);
  __l._M_len = 3;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&hg_update,__l,&local_139);
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string(local_60 + lVar3 + -0x40);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  cmProcessTools::OutputLogger::OutputLogger
            (&out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-err> ");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild((cmCTestVC *)this,&hg_update,(OutputParser *)&out,(OutputParser *)&err,
                      &local_40,Auto);
  std::__cxx11::string::~string((string *)&local_40);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&hg_update);
  std::__cxx11::string::~string((string *)&opts);
  hg_update.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hg_update.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hg_update.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hg_update,__args)
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[7]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hg_update,
             (char (*) [7])0x70947b);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hg_update,
             (char (*) [3])"-v");
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"UpdateOptions",(allocator<char> *)&err);
  cmCTest::GetCTestConfiguration(&opts,pcVar1,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  if (opts._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"HGUpdateOptions",(allocator<char> *)&args);
    cmCTest::GetCTestConfiguration((string *)&out,pcVar1,(string *)&err);
    std::__cxx11::string::operator=((string *)&opts,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&err);
  }
  cmSystemTools::ParseArguments(&args,&opts);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (&hg_update,&args);
  cmProcessTools::OutputLogger::OutputLogger
            (&out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"update-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"update-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,&hg_update,(OutputParser *)&out,(OutputParser *)&err,Auto);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::string::~string((string *)&opts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&hg_update);
  return bVar2;
}

Assistant:

bool cmCTestHG::UpdateImpl()
{
  // Use "hg pull" followed by "hg update" to update the working tree.
  {
    std::string hg = this->CommandLineTool;
    std::vector<std::string> hg_pull = { hg, "pull", "-v" };
    OutputLogger out(this->Log, "pull-out> ");
    OutputLogger err(this->Log, "pull-err> ");
    this->RunChild(hg_pull, &out, &err);
  }

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  std::vector<std::string> hg_update;
  hg_update.emplace_back(this->CommandLineTool);
  hg_update.emplace_back("update");
  hg_update.emplace_back("-v");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("HGUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  cm::append(hg_update, args);

  OutputLogger out(this->Log, "update-out> ");
  OutputLogger err(this->Log, "update-err> ");
  return this->RunUpdateCommand(hg_update, &out, &err);
}